

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O2

int omp_target_memcpy_rect
              (void *dst,void *src,size_t element_size,int num_dims,size_t *volume,
              size_t *dst_offsets,size_t *src_offsets,size_t *dst_dimensions,size_t *src_dimensions,
              int dst_device,int src_device)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  void *src_00;
  void *dst_00;
  size_t sVar5;
  undefined1 auVar6 [16];
  
  iVar1 = 0x7fffffff;
  if (((ulong)dst | (ulong)src) != 0) {
    auVar6._0_4_ = -(uint)(volume == (size_t *)0x0);
    auVar6._4_4_ = -(uint)(dst_offsets == (size_t *)0x0);
    auVar6._8_4_ = -(uint)(src_offsets == (size_t *)0x0);
    auVar6._12_4_ = -(uint)(dst_dimensions == (size_t *)0x0);
    iVar2 = movmskps((int)((ulong)dst | (ulong)src),auVar6);
    iVar1 = -1;
    if ((((iVar2 == 0) && (src_dimensions != (size_t *)0x0)) && (0 < num_dims)) &&
       (((element_size != 0 && (dst != (void *)0x0)) && (src != (void *)0x0)))) {
      if (num_dims == 1) {
        iVar1 = omp_target_memcpy(dst,src,*volume * element_size,*dst_offsets * element_size,
                                  element_size * *src_offsets,dst_device,src_device);
      }
      else {
        sVar4 = element_size;
        sVar5 = element_size;
        for (uVar3 = 1; (uint)num_dims != uVar3; uVar3 = uVar3 + 1) {
          sVar4 = sVar4 * dst_dimensions[uVar3];
          sVar5 = sVar5 * src_dimensions[uVar3];
        }
        uVar3 = 0xffffffffffffffff;
        src_00 = (void *)((long)src + *src_offsets * sVar5);
        dst_00 = (void *)((long)dst + *dst_offsets * sVar4);
        do {
          uVar3 = uVar3 + 1;
          if (*volume <= uVar3) {
            return 0;
          }
          iVar1 = omp_target_memcpy_rect
                            (dst_00,src_00,element_size,num_dims + -1,volume + 1,dst_offsets + 1,
                             src_offsets + 1,dst_dimensions + 1,src_dimensions + 1,dst_device,
                             src_device);
          src_00 = (void *)((long)src_00 + sVar5);
          dst_00 = (void *)((long)dst_00 + sVar4);
        } while (iVar1 == 0);
      }
    }
  }
  return iVar1;
}

Assistant:

EXTERN int omp_target_memcpy_rect(void *dst, void *src, size_t element_size,
    int num_dims, const size_t *volume, const size_t *dst_offsets,
    const size_t *src_offsets, const size_t *dst_dimensions,
    const size_t *src_dimensions, int dst_device, int src_device) {
  DP("Call to omp_target_memcpy_rect, dst device %d, src device %d, "
      "dst addr " DPxMOD ", src addr " DPxMOD ", dst offsets " DPxMOD ", "
      "src offsets " DPxMOD ", dst dims " DPxMOD ", src dims " DPxMOD ", "
      "volume " DPxMOD ", element size %zu, num_dims %d\n", dst_device,
      src_device, DPxPTR(dst), DPxPTR(src), DPxPTR(dst_offsets),
      DPxPTR(src_offsets), DPxPTR(dst_dimensions), DPxPTR(src_dimensions),
      DPxPTR(volume), element_size, num_dims);

  if (!(dst || src)) {
    DP("Call to omp_target_memcpy_rect returns max supported dimensions %d\n",
        INT_MAX);
    return INT_MAX;
  }

  if (!dst || !src || element_size < 1 || num_dims < 1 || !volume ||
      !dst_offsets || !src_offsets || !dst_dimensions || !src_dimensions) {
    DP("Call to omp_target_memcpy_rect with invalid arguments\n");
    return OFFLOAD_FAIL;
  }

  int rc;
  if (num_dims == 1) {
    rc = omp_target_memcpy(dst, src, element_size * volume[0],
        element_size * dst_offsets[0], element_size * src_offsets[0],
        dst_device, src_device);
  } else {
    size_t dst_slice_size = element_size;
    size_t src_slice_size = element_size;
    for (int i=1; i<num_dims; ++i) {
      dst_slice_size *= dst_dimensions[i];
      src_slice_size *= src_dimensions[i];
    }

    size_t dst_off = dst_offsets[0] * dst_slice_size;
    size_t src_off = src_offsets[0] * src_slice_size;
    for (size_t i=0; i<volume[0]; ++i) {
      rc = omp_target_memcpy_rect((char *) dst + dst_off + dst_slice_size * i,
          (char *) src + src_off + src_slice_size * i, element_size,
          num_dims - 1, volume + 1, dst_offsets + 1, src_offsets + 1,
          dst_dimensions + 1, src_dimensions + 1, dst_device, src_device);

      if (rc) {
        DP("Recursive call to omp_target_memcpy_rect returns unsuccessfully\n");
        return rc;
      }
    }
  }

  DP("omp_target_memcpy_rect returns %d\n", rc);
  return rc;
}